

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

bool absl::lts_20250127::str_format_internal::ConvertIntArg<unsigned_int>
               (uint v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  undefined2 uVar1;
  char *pcVar2;
  bool bVar3;
  Nonnull<char_*> pcVar4;
  anon_unknown_53 *paVar5;
  char *pcVar6;
  uint uVar7;
  undefined4 in_register_0000003c;
  anon_unknown_53 *this;
  FormatSinkImpl *in_R8;
  wchar_t v_00;
  IntDigits *out_str;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  string_view v_01;
  FormatConversionSpecImpl local_70;
  IntDigits *local_60;
  size_t local_58;
  undefined2 local_26;
  char local_24;
  char local_23 [3];
  
  this = (anon_unknown_53 *)CONCAT44(in_register_0000003c,v);
  conv_02._0_4_ = conv.precision_;
  conv_01._0_8_ = conv._0_8_;
  v_00 = conv._0_4_;
  local_70._0_8_ = conv_01._0_8_;
  local_70.precision_ = conv_02._0_4_;
  switch(conv_01._0_8_ & 0xff) {
  case 0:
    conv_02.precision_ = (int)sink;
    if ((v_00 & 0xff0000U) != 0x20000) {
      conv_01.precision_ = conv_02.precision_;
      anon_unknown_53::ConvertCharImpl
                ((char)v,conv_01,(FormatSinkImpl *)&switchD_00250f15::switchdataD_002d2a1c);
      return true;
    }
    conv_02.width_ = 0;
    bVar3 = anon_unknown_53::ConvertWCharTImpl(this,v_00,conv_02,in_R8);
    return bVar3;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = unsigned int]"
                 );
  case 2:
  case 3:
  case 5:
  case 0x12:
    out_str = (IntDigits *)&stack0xffffffffffffffb0;
    local_60 = out_str;
    pcVar4 = numbers_internal::FastIntToBuffer(v,(Nonnull<char_*>)out_str);
    goto LAB_00251010;
  case 4:
    out_str = (IntDigits *)&local_24;
    paVar5 = (anon_unknown_53 *)(ulong)v;
    do {
      uVar7 = (uint)this;
      *(byte *)((long)out_str + -1) = (byte)this & 7 | 0x30;
      out_str = (IntDigits *)((long)out_str + -1);
      paVar5 = (anon_unknown_53 *)((ulong)paVar5 >> 3);
      this = paVar5;
    } while (7 < uVar7);
    break;
  case 6:
    pcVar2 = local_23;
    paVar5 = (anon_unknown_53 *)(ulong)v;
    do {
      pcVar6 = pcVar2;
      uVar7 = (uint)this;
      uVar1 = *(undefined2 *)(numbers_internal::kHexTable + (ulong)(uVar7 & 0xff) * 2);
      *(undefined2 *)(pcVar6 + -3) = uVar1;
      this = (anon_unknown_53 *)((ulong)paVar5 >> 8);
      pcVar2 = pcVar6 + -2;
      paVar5 = this;
    } while (0xff < uVar7);
    out_str = (IntDigits *)(pcVar6 + -3);
    if ((char)uVar1 == '0') {
      out_str = (IntDigits *)(pcVar6 + -2);
    }
    break;
  case 7:
    out_str = (IntDigits *)&local_24;
    paVar5 = (anon_unknown_53 *)(ulong)v;
    do {
      uVar7 = (uint)this;
      *(char *)((long)out_str + -1) = "0123456789ABCDEF"[uVar7 & 0xf];
      out_str = (IntDigits *)((long)out_str + -1);
      paVar5 = (anon_unknown_53 *)((ulong)paVar5 >> 4);
      this = paVar5;
    } while (0xf < uVar7);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    bVar3 = ConvertFloatImpl((double)v,&local_70,sink);
    return bVar3;
  }
  pcVar4 = &local_24;
  local_60 = out_str;
LAB_00251010:
  conv_00._0_8_ = (long)pcVar4 - (long)out_str;
  local_58 = conv_00._0_8_;
  if (((undefined1  [12])conv & (undefined1  [12])0xff00) == (undefined1  [12])0x0) {
    v_01._M_str = (char *)local_60;
    v_01._M_len = conv_00._0_8_;
    FormatSinkImpl::Append(sink,v_01);
  }
  else {
    conv_00.precision_ = v_00;
    anon_unknown_53::ConvertIntImplInnerSlow
              (local_60,conv_00,(FormatSinkImpl *)(ulong)conv_02._0_4_);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}